

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadPolH_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  uint *puVar1;
  Assimp AVar2;
  char cVar3;
  long *plVar4;
  int *piVar5;
  _func_int **pp_Var6;
  _Elt_pointer ppNVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  Mesh *__p;
  _Elt_pointer psVar15;
  LineSplitter *splitter_00;
  byte *pbVar16;
  LineSplitter *pLVar17;
  byte *pbVar18;
  Logger *this_00;
  char *pcVar19;
  range_error *this_01;
  ChunkInfo *pCVar21;
  byte *pbVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  Node *pNVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  Assimp *pAVar31;
  size_type sVar32;
  undefined1 auVar33 [16];
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  Node *local_70;
  int local_64;
  iterator *local_60;
  Node *local_58;
  Type *local_50;
  ChunkInfo *local_48;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  char *pcVar20;
  
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"PolH");
    return;
  }
  __p = (Mesh *)operator_new(0x158);
  COB::Node::Node((Node *)__p,TYPE_MESH);
  (__p->super_Node)._vptr_Node = (_func_int **)&PTR__Mesh_00830140;
  (__p->texture_coords).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->texture_coords).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->texture_coords).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->vertex_positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->vertex_positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->vertex_positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->faces).super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->faces).super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->faces).super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p->draw_flags = 1;
  pCVar21 = (ChunkInfo *)&(__p->temp_map)._M_t._M_impl.super__Rb_tree_header;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pCVar21;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pCVar21;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = (undefined1  [8])__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Mesh*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8),__p);
  _Stack_90._M_pi = _Stack_38._M_pi;
  local_98 = local_40;
  _local_40 = (undefined1  [16])0x0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_98);
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  psVar15 = (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar15 ==
      (out->nodes).
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar21 = (ChunkInfo *)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar15 = (_Elt_pointer)(*(long *)&pCVar21[-1].version + 0x200);
  }
  pNVar26 = psVar15[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar28 = nfo->parent_id;
  uVar13 = nfo->version;
  uVar14 = nfo->size;
  (pNVar26->super_ChunkInfo).id = nfo->id;
  (pNVar26->super_ChunkInfo).parent_id = uVar28;
  (pNVar26->super_ChunkInfo).version = uVar13;
  (pNVar26->super_ChunkInfo).size = uVar14;
  pLVar17 = splitter;
  local_48 = nfo;
  splitter_00 = LineSplitter::operator++(splitter);
  local_70 = pNVar26;
  ReadBasicNodeInfo_Ascii((COBImporter *)pLVar17,pNVar26,splitter_00,pCVar21);
  if (*(int *)&splitter->mStream->end == *(int *)&splitter->mStream->current) {
    return;
  }
  local_50 = &local_70[1].type;
  local_58 = local_70 + 1;
  local_60 = &local_70[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start;
LAB_004d85c9:
  uVar24 = (splitter->mCur)._M_string_length;
  if ((uVar24 < 0xe) ||
     (plVar4 = (long *)(splitter->mCur)._M_dataplus._M_p,
     *(long *)((long)plVar4 + 6) != 0x7365636974726556 || *plVar4 != 0x655620646c726f57)) {
    if (0xf < uVar24) {
      pcVar20 = (splitter->mCur)._M_dataplus._M_p;
      auVar33[0] = -(*pcVar20 == 'T');
      auVar33[1] = -(pcVar20[1] == 'e');
      auVar33[2] = -(pcVar20[2] == 'x');
      auVar33[3] = -(pcVar20[3] == 't');
      auVar33[4] = -(pcVar20[4] == 'u');
      auVar33[5] = -(pcVar20[5] == 'r');
      auVar33[6] = -(pcVar20[6] == 'e');
      auVar33[7] = -(pcVar20[7] == ' ');
      auVar33[8] = -(pcVar20[8] == 'V');
      auVar33[9] = -(pcVar20[9] == 'e');
      auVar33[10] = -(pcVar20[10] == 'r');
      auVar33[0xb] = -(pcVar20[0xb] == 't');
      auVar33[0xc] = -(pcVar20[0xc] == 'i');
      auVar33[0xd] = -(pcVar20[0xd] == 'c');
      auVar33[0xe] = -(pcVar20[0xe] == 'e');
      auVar33[0xf] = -(pcVar20[0xf] == 's');
      if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar33[0xf] >> 7) << 0xf) == 0xffff) {
        for (pbVar22 = (byte *)(splitter->mCur)._M_dataplus._M_p;
            (*pbVar22 == 9 || (*pbVar22 == 0x20)); pbVar22 = pbVar22 + 1) {
        }
        lVar25 = 0;
        pbVar16 = pbVar22;
        do {
          while( true ) {
            pbVar18 = pbVar16 + 1;
            uVar24 = (ulong)*pbVar22;
            if (uVar24 < 0x21) break;
LAB_004d8827:
            pbVar22 = pbVar22 + 1;
            pbVar16 = pbVar18;
          }
          if ((0x100000200U >> (uVar24 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar24 & 0x3f) & 1) == 0) goto LAB_004d8827;
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error(this_01,"Token index out of range, EOL reached");
            goto LAB_004d8e27;
          }
          for (; (bVar27 = *pbVar22, bVar27 == 0x20 || (bVar27 == 9)); pbVar22 = pbVar22 + 1) {
            pbVar18 = pbVar18 + 1;
          }
          lVar25 = lVar25 + 1;
          pbVar16 = pbVar22;
        } while (lVar25 != 2);
        uVar24 = 0;
        if (0xf5 < (byte)(bVar27 - 0x3a)) {
          uVar24 = 0;
          do {
            uVar24 = (ulong)((uint)(byte)(bVar27 - 0x30) + (int)uVar24 * 10);
            bVar27 = *pbVar18;
            pbVar18 = pbVar18 + 1;
          } while (0xf5 < (byte)(bVar27 - 0x3a));
        }
        std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_58,uVar24
                  );
        if ((int)uVar24 != 0) {
          sVar32 = 0;
          do {
            pLVar17 = LineSplitter::operator++(splitter);
            iVar30 = *(int *)&pLVar17->mStream->end;
            if (iVar30 == *(int *)&pLVar17->mStream->current) break;
            pp_Var6 = local_58->_vptr_Node;
            for (pAVar31 = (Assimp *)(splitter->mCur)._M_dataplus._M_p;
                (*pAVar31 == (Assimp)0x20 || (*pAVar31 == (Assimp)0x9)); pAVar31 = pAVar31 + 1) {
            }
            auVar11._12_4_ = 0;
            auVar11._0_12_ = stack0xffffffffffffff6c;
            _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                        (auVar11 << 0x20);
            pAVar31 = (Assimp *)
                      fast_atoreal_move<float>(pAVar31,local_98,(float *)0x1,SUB41(iVar30,0));
            *(undefined4 *)(pp_Var6 + sVar32) = local_98._0_4_;
            for (; (AVar2 = *pAVar31, AVar2 == (Assimp)0x20 || (AVar2 == (Assimp)0x9));
                pAVar31 = pAVar31 + 1) {
            }
            auVar12._12_4_ = 0;
            auVar12._0_12_ = stack0xffffffffffffff6c;
            _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                        (auVar12 << 0x20);
            fast_atoreal_move<float>(pAVar31,local_98,(float *)0x1,(bool)AVar2);
            *(undefined4 *)((long)pp_Var6 + sVar32 * 8 + 4) = local_98._0_4_;
            sVar32 = sVar32 + 1;
          } while (sVar32 != uVar24);
        }
        goto LAB_004d8cf4;
      }
    }
    if ((4 < uVar24) &&
       (piVar5 = (int *)(splitter->mCur)._M_dataplus._M_p,
       (char)piVar5[1] == 's' && *piVar5 == 0x65636146)) {
      pbVar22 = (byte *)(splitter->mCur)._M_dataplus._M_p;
      pbVar16 = pbVar22;
      while( true ) {
        pbVar16 = pbVar16 + 1;
        if ((*pbVar22 != 9) && (*pbVar22 != 0x20)) break;
        pbVar22 = pbVar22 + 1;
      }
      do {
        uVar24 = (ulong)*pbVar22;
        if (uVar24 < 0x21) {
          if ((0x100000200U >> (uVar24 & 0x3f) & 1) != 0) goto LAB_004d8972;
          if ((0x3401UL >> (uVar24 & 0x3f) & 1) != 0) {
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error(this_01,"Token index out of range, EOL reached");
            goto LAB_004d8e27;
          }
        }
        pbVar22 = pbVar22 + 1;
        pbVar16 = pbVar16 + 1;
      } while( true );
    }
    if ((8 < uVar24) &&
       (plVar4 = (long *)(splitter->mCur)._M_dataplus._M_p,
       (char)plVar4[1] == 's' && *plVar4 == 0x67616c4677617244)) {
      pcVar20 = (splitter->mCur)._M_dataplus._M_p;
      do {
        do {
          pcVar19 = pcVar20 + 1;
          cVar3 = *pcVar20;
          pcVar20 = pcVar19;
        } while (cVar3 == '\t');
      } while (cVar3 == ' ');
      do {
        uVar24 = (ulong)(byte)pcVar19[-1];
        if (uVar24 < 0x21) {
          if ((0x100000200U >> (uVar24 & 0x3f) & 1) != 0) {
            for (; (cVar3 = pcVar19[-1], cVar3 == ' ' || (cVar3 == '\t')); pcVar19 = pcVar19 + 1) {
            }
            iVar30 = 0;
            if (0xf5 < (byte)(cVar3 - 0x3aU)) {
              iVar30 = 0;
              do {
                iVar30 = (uint)(byte)(cVar3 - 0x30) + iVar30 * 10;
                cVar3 = *pcVar19;
                pcVar19 = pcVar19 + 1;
              } while (0xf5 < (byte)(cVar3 - 0x3aU));
            }
            *(int *)&local_70[1].temp_children.
                     super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node = iVar30;
            return;
          }
          if ((0x3401UL >> (uVar24 & 0x3f) & 1) != 0) {
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error(this_01,"Token index out of range, EOL reached");
LAB_004d8e27:
            __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
          }
        }
        pcVar19 = pcVar19 + 1;
      } while( true );
    }
  }
  else {
    for (pbVar22 = (byte *)(splitter->mCur)._M_dataplus._M_p; (*pbVar22 == 9 || (*pbVar22 == 0x20));
        pbVar22 = pbVar22 + 1) {
    }
    lVar25 = 0;
    pbVar16 = pbVar22;
    do {
      while( true ) {
        pbVar18 = pbVar16 + 1;
        uVar24 = (ulong)*pbVar22;
        if (uVar24 < 0x21) break;
LAB_004d86ae:
        pbVar22 = pbVar22 + 1;
        pbVar16 = pbVar18;
      }
      if ((0x100000200U >> (uVar24 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar24 & 0x3f) & 1) == 0) goto LAB_004d86ae;
        this_01 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_01,"Token index out of range, EOL reached");
        goto LAB_004d8e27;
      }
      for (; (bVar27 = *pbVar22, bVar27 == 0x20 || (bVar27 == 9)); pbVar22 = pbVar22 + 1) {
        pbVar18 = pbVar18 + 1;
      }
      lVar25 = lVar25 + 1;
      pbVar16 = pbVar22;
    } while (lVar25 != 2);
    uVar24 = 0;
    if (0xf5 < (byte)(bVar27 - 0x3a)) {
      uVar24 = 0;
      do {
        uVar24 = (ulong)((uint)(byte)(bVar27 - 0x30) + (int)uVar24 * 10);
        bVar27 = *pbVar18;
        pbVar18 = pbVar18 + 1;
      } while (0xf5 < (byte)(bVar27 - 0x3a));
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_50,uVar24);
    if ((int)uVar24 != 0) {
      sVar32 = 0;
      do {
        pLVar17 = LineSplitter::operator++(splitter);
        if (*(int *)&pLVar17->mStream->end == *(int *)&pLVar17->mStream->current) break;
        for (pAVar31 = (Assimp *)(splitter->mCur)._M_dataplus._M_p;
            (*pAVar31 == (Assimp)0x20 || (*pAVar31 == (Assimp)0x9)); pAVar31 = pAVar31 + 1) {
        }
        puVar1 = (uint *)(*(long *)local_50 + sVar32 * 0xc);
        auVar8._12_4_ = 0;
        auVar8._0_12_ = stack0xffffffffffffff6c;
        _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)(auVar8 << 0x20);
        pAVar31 = (Assimp *)
                  fast_atoreal_move<float>
                            (pAVar31,local_98,(float *)0x1,(bool)((char)sVar32 * '\x03'));
        *puVar1 = local_98._0_4_;
        for (; (AVar2 = *pAVar31, AVar2 == (Assimp)0x20 || (AVar2 == (Assimp)0x9));
            pAVar31 = pAVar31 + 1) {
        }
        auVar9._12_4_ = 0;
        auVar9._0_12_ = stack0xffffffffffffff6c;
        _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)(auVar9 << 0x20);
        pAVar31 = (Assimp *)fast_atoreal_move<float>(pAVar31,local_98,(float *)0x1,(bool)AVar2);
        puVar1[1] = local_98._0_4_;
        for (; (AVar2 = *pAVar31, AVar2 == (Assimp)0x20 || (AVar2 == (Assimp)0x9));
            pAVar31 = pAVar31 + 1) {
        }
        auVar10._12_4_ = 0;
        auVar10._0_12_ = stack0xffffffffffffff6c;
        _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)(auVar10 << 0x20);
        fast_atoreal_move<float>(pAVar31,local_98,(float *)0x1,(bool)AVar2);
        puVar1[2] = local_98._0_4_;
        sVar32 = sVar32 + 1;
      } while (sVar32 != uVar24);
    }
  }
  goto LAB_004d8cf4;
LAB_004d8972:
  for (; (bVar27 = *pbVar22, bVar27 == 0x20 || (bVar27 == 9)); pbVar22 = pbVar22 + 1) {
    pbVar16 = pbVar16 + 1;
  }
  uVar24 = 0;
  if (0xf5 < (byte)(bVar27 - 0x3a)) {
    uVar24 = 0;
    do {
      uVar24 = (ulong)((uint)(byte)(bVar27 - 0x30) + (int)uVar24 * 10);
      bVar27 = *pbVar16;
      pbVar16 = pbVar16 + 1;
    } while (0xf5 < (byte)(bVar27 - 0x3a));
  }
  std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
            ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_60,uVar24);
  if ((int)uVar24 != 0) {
    iVar30 = 0;
    do {
      pLVar17 = LineSplitter::operator++(splitter);
      if (*(int *)&pLVar17->mStream->end == *(int *)&pLVar17->mStream->current) break;
      uVar23 = (splitter->mCur)._M_string_length;
      local_64 = iVar30;
      if ((uVar23 < 4) || (*(int *)(splitter->mCur)._M_dataplus._M_p != 0x656c6f48)) {
        if ((uVar23 < 4) || (*(int *)(splitter->mCur)._M_dataplus._M_p != 0x65636146)) {
          local_98 = (undefined1  [8])&local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Expected Face line","");
          ThrowException((string *)local_98);
        }
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )0x0;
        local_98 = (undefined1  [8])0x0;
        _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
        emplace_back<Assimp::COB::Face>
                  ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_60,
                   (Face *)local_98);
        if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(_Stack_90._M_pi,local_88._8_8_ - (long)_Stack_90._M_pi);
        }
        ppNVar7 = local_70[1].temp_children.
                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
        for (pbVar22 = (byte *)(splitter->mCur)._M_dataplus._M_p;
            (*pbVar22 == 9 || (*pbVar22 == 0x20)); pbVar22 = pbVar22 + 1) {
        }
        lVar25 = 0;
        pbVar16 = pbVar22;
        do {
          while( true ) {
            pbVar18 = pbVar16 + 1;
            uVar23 = (ulong)*pbVar22;
            if (uVar23 < 0x21) break;
LAB_004d8a88:
            pbVar22 = pbVar22 + 1;
            pbVar16 = pbVar18;
          }
          if ((0x100000200U >> (uVar23 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar23 & 0x3f) & 1) == 0) goto LAB_004d8a88;
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error(this_01,"Token index out of range, EOL reached");
            goto LAB_004d8e27;
          }
          for (; (bVar27 = *pbVar22, bVar27 == 0x20 || (bVar27 == 9)); pbVar22 = pbVar22 + 1) {
            pbVar18 = pbVar18 + 1;
          }
          lVar25 = lVar25 + 1;
          pbVar16 = pbVar22;
        } while (lVar25 != 2);
        if ((byte)(bVar27 - 0x3a) < 0xf6) {
          sVar32 = 0;
        }
        else {
          uVar28 = 0;
          do {
            uVar28 = (uint)(byte)(bVar27 - 0x30) + uVar28 * 10;
            bVar27 = *pbVar18;
            pbVar18 = pbVar18 + 1;
          } while (0xf5 < (byte)(bVar27 - 0x3a));
          sVar32 = (size_type)uVar28;
        }
        std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::resize
                  ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                   (ppNVar7 + -3),sVar32);
        for (pbVar22 = (byte *)(splitter->mCur)._M_dataplus._M_p;
            (*pbVar22 == 9 || (*pbVar22 == 0x20)); pbVar22 = pbVar22 + 1) {
        }
        lVar25 = 0;
        pbVar16 = pbVar22;
        do {
          while( true ) {
            pbVar18 = pbVar16 + 1;
            uVar23 = (ulong)*pbVar22;
            if (uVar23 < 0x21) break;
LAB_004d8b15:
            pbVar22 = pbVar22 + 1;
            pbVar16 = pbVar18;
          }
          if ((0x100000200U >> (uVar23 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar23 & 0x3f) & 1) == 0) goto LAB_004d8b15;
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error(this_01,"Token index out of range, EOL reached");
            goto LAB_004d8e27;
          }
          for (; (bVar27 = *pbVar22, bVar27 == 0x20 || (bVar27 == 9)); pbVar22 = pbVar22 + 1) {
            pbVar18 = pbVar18 + 1;
          }
          lVar25 = lVar25 + 1;
          pbVar16 = pbVar22;
        } while (lVar25 != 4);
        iVar30 = 0;
        if (0xf5 < (byte)(bVar27 - 0x3a)) {
          iVar30 = 0;
          do {
            iVar30 = (uint)(byte)(bVar27 - 0x30) + iVar30 * 10;
            bVar27 = *pbVar18;
            pbVar18 = pbVar18 + 1;
          } while (0xf5 < (byte)(bVar27 - 0x3a));
        }
        *(int *)((long)ppNVar7 + -0x1c) = iVar30;
        for (pbVar22 = (byte *)(splitter->mCur)._M_dataplus._M_p;
            (*pbVar22 == 9 || (*pbVar22 == 0x20)); pbVar22 = pbVar22 + 1) {
        }
        lVar25 = 0;
        pbVar16 = pbVar22;
        do {
          while( true ) {
            pbVar18 = pbVar16 + 1;
            uVar23 = (ulong)*pbVar22;
            if (uVar23 < 0x21) break;
LAB_004d8b9a:
            pbVar22 = pbVar22 + 1;
            pbVar16 = pbVar18;
          }
          if ((0x100000200U >> (uVar23 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar23 & 0x3f) & 1) == 0) goto LAB_004d8b9a;
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error(this_01,"Token index out of range, EOL reached");
            goto LAB_004d8e27;
          }
          for (; (bVar27 = *pbVar22, bVar27 == 0x20 || (bVar27 == 9)); pbVar22 = pbVar22 + 1) {
            pbVar18 = pbVar18 + 1;
          }
          lVar25 = lVar25 + 1;
          pbVar16 = pbVar22;
        } while (lVar25 != 6);
        iVar30 = 0;
        if (0xf5 < (byte)(bVar27 - 0x3a)) {
          iVar30 = 0;
          do {
            iVar30 = (uint)(byte)(bVar27 - 0x30) + iVar30 * 10;
            bVar27 = *pbVar18;
            pbVar18 = pbVar18 + 1;
          } while (0xf5 < (byte)(bVar27 - 0x3a));
        }
        *(int *)(ppNVar7 + -4) = iVar30;
        pLVar17 = LineSplitter::operator++(splitter);
        pNVar26 = ppNVar7[-3];
        if (ppNVar7[-2] != pNVar26) {
          uVar23 = 0;
          pbVar22 = (byte *)(pLVar17->mCur)._M_dataplus._M_p;
          do {
            do {
              pbVar16 = pbVar22 + 1;
              uVar29 = (ulong)*pbVar22;
              if (0x3c < uVar29) {
LAB_004d8e3d:
                local_98 = (undefined1  [8])&local_88;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"Expected < token in Face entry","");
                ThrowException((string *)local_98);
              }
              pbVar22 = pbVar16;
            } while ((0x100000200U >> (uVar29 & 0x3f) & 1) != 0);
            if (uVar29 != 0x3c) {
              if ((0x3401UL >> (uVar29 & 0x3f) & 1) != 0) {
                local_98 = (undefined1  [8])&local_88;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"Expected EOL token in Face entry","");
                ThrowException((string *)local_98);
              }
              goto LAB_004d8e3d;
            }
            bVar27 = *pbVar16;
            iVar30 = 0;
            if (0xf5 < (byte)(bVar27 - 0x3a)) {
              iVar30 = 0;
              do {
                iVar30 = (uint)(byte)(bVar27 - 0x30) + iVar30 * 10;
                bVar27 = pbVar16[1];
                pbVar16 = pbVar16 + 1;
              } while (0xf5 < (byte)(bVar27 - 0x3a));
            }
            *(int *)(&pNVar26->_vptr_Node + uVar23) = iVar30;
            if (*pbVar16 != 0x2c) {
              local_98 = (undefined1  [8])&local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,"Expected , token in Face entry","");
              ThrowException((string *)local_98);
            }
            bVar27 = pbVar16[1];
            pbVar16 = pbVar16 + 1;
            uVar28 = 0;
            if (0xf5 < (byte)(bVar27 - 0x3a)) {
              uVar28 = 0;
              do {
                uVar28 = (uint)(byte)(bVar27 - 0x30) + uVar28 * 10;
                bVar27 = pbVar16[1];
                pbVar16 = pbVar16 + 1;
              } while (0xf5 < (byte)(bVar27 - 0x3a));
            }
            (((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
             (ppNVar7 + -3))->
            super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>)
            ._M_impl.super__Vector_impl_data._M_start[uVar23].uv_idx = uVar28;
            if (*pbVar16 != 0x3e) {
              local_98 = (undefined1  [8])&local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,"Expected < token in Face entry","");
              ThrowException((string *)local_98);
            }
            pbVar22 = pbVar16 + 1;
            uVar23 = uVar23 + 1;
            pNVar26 = ppNVar7[-3];
          } while (uVar23 < (ulong)((long)ppNVar7[-2] - (long)pNVar26 >> 3));
        }
      }
      else {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"Skipping unsupported `Hole` line");
      }
      iVar30 = local_64 + 1;
    } while (iVar30 != (int)uVar24);
  }
  if (local_48->version < 5) {
    return;
  }
LAB_004d8cf4:
  LineSplitter::operator++(splitter);
  if (*(int *)&splitter->mStream->end == *(int *)&splitter->mStream->current) {
    return;
  }
  goto LAB_004d85c9;
}

Assistant:

void COBImporter::ReadPolH_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"PolH");
    }

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    // the chunk has a fixed order of components, but some are not interesting of us so
    // we're just looking for keywords in arbitrary order. The end of the chunk is
    // either the last `Face` or the `DrawFlags` attribute, depending on the format ver.
    for(;splitter;++splitter) {
        if (splitter.match_start("World Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.vertex_positions.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector3D& v = msh.vertex_positions[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
                SkipSpaces(&s);
                v.z = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Texture Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.texture_coords.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector2D& v = msh.texture_coords[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Faces")) {
            const unsigned int cnt = strtoul10(splitter[1]);
            msh.faces.reserve(cnt);

            for(unsigned int cur = 0; cur < cnt && ++splitter ;++cur) {
                if (splitter.match_start("Hole")) {
                    ASSIMP_LOG_WARN( "Skipping unsupported `Hole` line" );
                    continue;
                }

                if (!splitter.match_start("Face")) {
                    ThrowException("Expected Face line");
                }

                msh.faces.push_back(Face());
                Face& face = msh.faces.back();

                face.indices.resize(strtoul10(splitter[2]));
                face.flags = strtoul10(splitter[4]);
                face.material = strtoul10(splitter[6]);

                const char* s = (++splitter)->c_str();
                for(size_t i = 0; i < face.indices.size(); ++i) {
                    if(!SkipSpaces(&s)) {
                        ThrowException("Expected EOL token in Face entry");
                    }
                    if ('<' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                    face.indices[i].pos_idx = strtoul10(s,&s);
                    if (',' != *s++) {
                        ThrowException("Expected , token in Face entry");
                    }
                    face.indices[i].uv_idx = strtoul10(s,&s);
                    if ('>' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                }
            }
            if (nfo.version <= 4) {
                break;
            }
        }
        else if (splitter.match_start("DrawFlags")) {
            msh.draw_flags = strtoul10(splitter[1]);
            break;
        }
    }
}